

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O0

void __thiscall
ResourcesDictionary::AddExtGStateMapping
          (ResourcesDictionary *this,ObjectIDType inExtGStateID,string *inExtGStateName)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *inExtGStateName_local;
  ObjectIDType inExtGStateID_local;
  ResourcesDictionary *this_local;
  
  it._M_node = (_Base_ptr)inExtGStateName;
  inExtGStateName_local = (string *)inExtGStateID;
  inExtGStateID_local = (ObjectIDType)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->mExtGStates,(key_type *)&inExtGStateName_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->mExtGStates);
  bVar2 = std::operator==(&local_28,&local_30);
  iVar1 = it;
  if (bVar2) {
    std::
    pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_long_&,_true>
              (&local_58,(unsigned_long *)&inExtGStateName_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
    std::
    map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert(&this->mExtGStates,&local_58);
    std::
    pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_58);
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator=((string *)&ppVar3->second,(string *)iVar1._M_node);
  }
  return;
}

Assistant:

void ResourcesDictionary::AddExtGStateMapping(ObjectIDType inExtGStateID, const std::string& inExtGStateName)
{
	ObjectIDTypeToStringMap::iterator it = mExtGStates.find(inExtGStateID);

	if(it == mExtGStates.end())
		mExtGStates.insert(ObjectIDTypeToStringMap::value_type(inExtGStateID,inExtGStateName));
	else
		it->second = inExtGStateName;
}